

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O1

int __thiscall
soul::ModuleCloner::clone
          (ModuleCloner *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  undefined8 uVar1;
  Connection *pCVar2;
  mapped_type *pmVar3;
  ProcessorInstance *pPVar4;
  key_type local_20;
  
  pCVar2 = PoolAllocator::allocate<soul::heart::Connection,soul::CodeLocation_const&>
                     (&this->newModule->allocator->pool,(CodeLocation *)(__fn + 8));
  pCVar2->interpolationType = *(InterpolationType *)(__fn + 0xa8);
  if (*(ProcessorInstance **)(__fn + 0x18) == (ProcessorInstance *)0x0) {
    pPVar4 = (ProcessorInstance *)0x0;
  }
  else {
    local_20.object = *(ProcessorInstance **)(__fn + 0x18);
    pmVar3 = std::__detail::
             _Map_base<soul::pool_ref<const_soul::heart::ProcessorInstance>,_std::pair<const_soul::pool_ref<const_soul::heart::ProcessorInstance>,_soul::pool_ptr<soul::heart::ProcessorInstance>_>,_std::allocator<std::pair<const_soul::pool_ref<const_soul::heart::ProcessorInstance>,_soul::pool_ptr<soul::heart::ProcessorInstance>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<const_soul::heart::ProcessorInstance>_>,_std::hash<soul::pool_ref<const_soul::heart::ProcessorInstance>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<soul::pool_ref<const_soul::heart::ProcessorInstance>,_std::pair<const_soul::pool_ref<const_soul::heart::ProcessorInstance>,_soul::pool_ptr<soul::heart::ProcessorInstance>_>,_std::allocator<std::pair<const_soul::pool_ref<const_soul::heart::ProcessorInstance>,_soul::pool_ptr<soul::heart::ProcessorInstance>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<const_soul::heart::ProcessorInstance>_>,_std::hash<soul::pool_ref<const_soul::heart::ProcessorInstance>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->processorInstanceMappings,&local_20);
    pPVar4 = pmVar3->object;
  }
  (pCVar2->source).processor.object = pPVar4;
  std::__cxx11::string::_M_assign((string *)&(pCVar2->source).endpointName);
  uVar1 = *(undefined8 *)(__fn + 0x48);
  (pCVar2->source).endpointIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload =
       *(_Storage<unsigned_long,_true> *)(__fn + 0x40);
  *(undefined8 *)
   &(pCVar2->source).endpointIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = uVar1;
  if (*(ProcessorInstance **)(__fn + 0x60) == (ProcessorInstance *)0x0) {
    pPVar4 = (ProcessorInstance *)0x0;
  }
  else {
    local_20.object = *(ProcessorInstance **)(__fn + 0x60);
    pmVar3 = std::__detail::
             _Map_base<soul::pool_ref<const_soul::heart::ProcessorInstance>,_std::pair<const_soul::pool_ref<const_soul::heart::ProcessorInstance>,_soul::pool_ptr<soul::heart::ProcessorInstance>_>,_std::allocator<std::pair<const_soul::pool_ref<const_soul::heart::ProcessorInstance>,_soul::pool_ptr<soul::heart::ProcessorInstance>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<const_soul::heart::ProcessorInstance>_>,_std::hash<soul::pool_ref<const_soul::heart::ProcessorInstance>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<soul::pool_ref<const_soul::heart::ProcessorInstance>,_std::pair<const_soul::pool_ref<const_soul::heart::ProcessorInstance>,_soul::pool_ptr<soul::heart::ProcessorInstance>_>,_std::allocator<std::pair<const_soul::pool_ref<const_soul::heart::ProcessorInstance>,_soul::pool_ptr<soul::heart::ProcessorInstance>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<const_soul::heart::ProcessorInstance>_>,_std::hash<soul::pool_ref<const_soul::heart::ProcessorInstance>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->processorInstanceMappings,&local_20);
    pPVar4 = pmVar3->object;
  }
  (pCVar2->dest).processor.object = pPVar4;
  std::__cxx11::string::_M_assign((string *)&(pCVar2->dest).endpointName);
  uVar1 = *(undefined8 *)(__fn + 0x90);
  (pCVar2->dest).endpointIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload =
       *(_Storage<unsigned_long,_true> *)(__fn + 0x88);
  *(undefined8 *)
   &(pCVar2->dest).endpointIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = uVar1;
  uVar1 = *(undefined8 *)(__fn + 0xb8);
  (pCVar2->delayLength).super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_payload = *(_Storage<long,_true> *)(__fn + 0xb0);
  *(undefined8 *)
   &(pCVar2->delayLength).super__Optional_base<long,_true,_true>._M_payload.
    super__Optional_payload_base<long>._M_engaged = uVar1;
  return (int)pCVar2;
}

Assistant:

heart::Connection& clone (const heart::Connection& old)
    {
        auto& c = newModule.allocate<heart::Connection> (old.location);
        c.interpolationType     = old.interpolationType;
        c.source.processor      = getRemappedProcessorInstance (old.source.processor);
        c.source.endpointName   = old.source.endpointName;
        c.source.endpointIndex  = old.source.endpointIndex;
        c.dest.processor        = getRemappedProcessorInstance (old.dest.processor);
        c.dest.endpointName     = old.dest.endpointName;
        c.dest.endpointIndex    = old.dest.endpointIndex;
        c.delayLength           = old.delayLength;
        return c;
    }